

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O0

logical pnga_update_ghost_dir(Integer g_a,Integer pdim,Integer pdir,logical pflag)

{
  short sVar1;
  short sVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  Integer IVar6;
  logical lVar7;
  void *__ptr;
  long *__ptr_00;
  size_t sVar8;
  Integer IVar9;
  long lVar10;
  long lVar11;
  long in_RCX;
  undefined8 in_RDX;
  long lVar12;
  long in_RSI;
  long in_RDI;
  int _d_7;
  int _i_10;
  int _ndim_9;
  int _i_9;
  int _itmp_3;
  int _offset_3;
  int _ndim_8;
  int _i_8;
  int _index_7 [7];
  int _ndim_7;
  int _i_7;
  int _itmp_2;
  int _ndim_6;
  int _i_6;
  int _index_6 [7];
  int _ndim_5;
  int _i_5;
  Integer _dimpos_3;
  Integer _dimstart_3;
  Integer _dim_3;
  Integer _index_5;
  Integer _d_6;
  Integer _nb_3;
  Integer _loc_3;
  Integer _dimpos_2;
  Integer _dimstart_2;
  Integer _dim_2;
  Integer _index_4;
  Integer _d_5;
  Integer _nb_2;
  Integer _loc_2;
  Integer _hi_1 [7];
  Integer _lo_1 [7];
  Integer _offset_2;
  Integer _last_1;
  Integer _factor_1;
  Integer _d_4;
  int _ndim_4;
  int _i_4;
  int _itmp_1;
  int _offset_1;
  int _ndim_3;
  int _i_3;
  int _index_3 [7];
  int _ndim_2;
  int _i_2;
  int _itmp;
  int _ndim_1;
  int _i_1;
  int _index_2 [7];
  int _ndim;
  int _i;
  Integer _dimpos_1;
  Integer _dimstart_1;
  Integer _dim_1;
  Integer _index_1;
  Integer _d_3;
  Integer _nb_1;
  Integer _loc_1;
  Integer _dimpos;
  Integer _dimstart;
  Integer _dim;
  Integer _index;
  Integer _d_2;
  Integer _nb;
  Integer _loc;
  Integer _hi [7];
  Integer _lo [7];
  Integer _offset;
  Integer _last;
  Integer _factor;
  Integer _d_1;
  char err_string [256];
  char *str;
  int _l;
  int _d;
  int local_sync_end;
  int local_sync_begin;
  Integer *_ga_proclist;
  Integer *_ga_map;
  Integer p_handle;
  Integer me;
  char *ptr_rem;
  char *ptr_loc;
  int count [7];
  int stride_rem [7];
  int stride_loc [7];
  logical flag;
  Integer ld_rem [7];
  Integer ld_loc [7];
  Integer plo_rem [7];
  Integer thi_rem [7];
  Integer tlo_rem [7];
  Integer phi_loc [7];
  Integer plo_loc [7];
  Integer hi_loc [7];
  Integer lo_loc [7];
  Integer dims [7];
  Integer width [7];
  Integer idir;
  Integer idim;
  Integer itmp;
  Integer i;
  Integer ndim;
  Integer size;
  Integer lmask [7];
  Integer mask [7];
  Integer ntot;
  Integer proc_rem;
  Integer handle;
  Integer np;
  Integer inx;
  Integer ipx;
  Integer idx;
  int in_stack_fffffffffffff75c;
  int *in_stack_fffffffffffff760;
  int iVar13;
  int iVar14;
  int in_stack_fffffffffffff770;
  int in_stack_fffffffffffff774;
  int in_stack_fffffffffffff778;
  int in_stack_fffffffffffff77c;
  int in_stack_fffffffffffff780;
  int in_stack_fffffffffffff784;
  int local_878 [2];
  int in_stack_fffffffffffff790;
  int local_858;
  int local_854;
  int local_84c;
  int local_848 [10];
  int local_820;
  int local_81c;
  long local_818;
  long local_810;
  long local_808;
  long local_800;
  long local_7f8;
  long local_7f0;
  long local_7e8;
  long local_7e0;
  long local_7d8;
  long local_7d0;
  long local_7c8;
  long local_7c0;
  long local_7b8;
  long local_7b0;
  long local_7a8 [8];
  long local_768 [7];
  long local_730;
  long local_728;
  long local_720;
  long local_718;
  int local_710;
  int local_70c;
  int in_stack_fffffffffffff8f8;
  int in_stack_fffffffffffff8fc;
  int in_stack_fffffffffffff900;
  int in_stack_fffffffffffff904;
  int local_6f8 [7];
  int local_6dc;
  int local_6d8;
  int local_6d4;
  int local_6d0;
  int local_6cc;
  int local_6c8 [6];
  Integer in_stack_fffffffffffff950;
  int local_69c;
  long local_690;
  long local_680;
  long local_678;
  long local_670;
  long local_658;
  long local_648;
  long local_640;
  long local_638;
  long local_628 [8];
  long local_5e8 [8];
  long local_5a8;
  long local_5a0;
  Integer *in_stack_fffffffffffffa68;
  Integer *in_stack_fffffffffffffa70;
  Integer in_stack_fffffffffffffa78;
  Integer in_stack_fffffffffffffa80;
  int local_478;
  int local_474;
  int local_438 [8];
  int local_418 [8];
  int local_3f8 [10];
  long local_3d0;
  long local_3c8 [8];
  long local_388 [8];
  C_Integer aCStack_348 [8];
  long local_308 [8];
  long local_2c8 [8];
  long alStack_288 [8];
  C_Integer aCStack_248 [8];
  long local_208 [8];
  long local_1c8 [8];
  C_Integer aCStack_188 [8];
  C_Integer aCStack_148 [8];
  undefined8 local_108;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long alStack_d8 [5];
  Integer *in_stack_ffffffffffffff50;
  Integer *in_stack_ffffffffffffff58;
  Integer *in_stack_ffffffffffffff60;
  Integer *in_stack_ffffffffffffff68;
  Integer *in_stack_ffffffffffffff70;
  Integer in_stack_ffffffffffffff78;
  long local_60;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  
  lVar5 = in_RDI + 1000;
  IVar6 = pnga_nodeid();
  iVar4 = _ga_sync_end;
  iVar14 = _ga_sync_begin;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  lVar7 = pnga_has_ghosts(in_RDI);
  if (lVar7 != 0) {
    if (iVar14 != 0) {
      pnga_pgroup_sync((Integer)in_stack_fffffffffffff760);
    }
    local_e0 = (long)GA[lVar5].elemsize;
    local_e8 = (long)GA[lVar5].ndim;
    local_108 = in_RDX;
    local_100 = in_RSI;
    for (local_30 = 0; local_30 < local_e8; local_30 = local_30 + 1) {
      aCStack_148[local_30] = GA[lVar5].width[local_30];
      aCStack_188[local_30] = GA[lVar5].dims[local_30];
    }
    local_38 = 0;
    for (local_30 = 0; local_30 < local_e8; local_30 = local_30 + 1) {
      for (local_48 = 0; local_48 < GA[lVar5].nblock[local_30]; local_48 = local_48 + 1) {
        if (local_48 < GA[lVar5].nblock[local_30] + -1) {
          if ((GA[lVar5].mapc[local_38 + 1] - GA[lVar5].mapc[local_38]) + 1 < aCStack_148[local_30])
          {
            return 0;
          }
        }
        else if ((GA[lVar5].dims[local_30] - GA[lVar5].mapc[local_38]) + 1 < aCStack_148[local_30])
        {
          return 0;
        }
        local_38 = local_38 + 1;
      }
    }
    local_3d0 = in_RCX;
    __ptr = malloc((GAnproc * 0xe + 1) * 8);
    if (__ptr == (void *)0x0) {
      pnga_error((char *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
                 CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
    }
    __ptr_00 = (long *)malloc((GAnproc * 0xe + 1) * 8);
    if (__ptr_00 == (long *)0x0) {
      pnga_error((char *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
                 CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
    }
    pnga_distribution(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,in_stack_fffffffffffffa70,
                      in_stack_fffffffffffffa68);
    local_60 = 1;
    if (local_3d0 != 0) {
      for (local_30 = 0; local_30 < local_e8 + -1; local_30 = local_30 + 1) {
        local_60 = local_60 * 3;
      }
    }
    for (local_38 = 0; local_38 < local_60; local_38 = local_38 + 1) {
      if (local_3d0 == 0) {
        for (local_30 = 0; local_30 < local_e8 + -1; local_30 = local_30 + 1) {
          alStack_d8[local_30] = 0;
        }
      }
      else {
        local_f8 = local_38;
        for (local_30 = 0; local_30 < local_e8 + -1; local_30 = local_30 + 1) {
          local_f0 = local_f8 % 3;
          alStack_d8[local_30] = local_f0 + -1;
          local_f8 = (local_f8 - local_f0) / 3;
        }
      }
      local_40 = 0;
      for (local_30 = 0; local_30 < local_e8; local_30 = local_30 + 1) {
        if (local_30 == local_100 + -1) {
          *(undefined8 *)(&stack0xffffffffffffff68 + local_30 * 8) = local_108;
        }
        else {
          *(long *)(&stack0xffffffffffffff68 + local_30 * 8) = alStack_d8[local_40];
          local_40 = local_40 + 1;
        }
      }
      for (local_30 = 0; local_30 < local_e8; local_30 = local_30 + 1) {
        if (*(long *)(&stack0xffffffffffffff68 + local_30 * 8) == 0) {
          local_2c8[local_30] = local_1c8[local_30];
          local_308[local_30] = local_208[local_30];
        }
        else if (*(long *)(&stack0xffffffffffffff68 + local_30 * 8) == -1) {
          if (local_1c8[local_30] < 2) {
            local_2c8[local_30] = (aCStack_188[local_30] - aCStack_148[local_30]) + 1;
            local_308[local_30] = aCStack_188[local_30];
          }
          else {
            local_2c8[local_30] = local_1c8[local_30] - aCStack_148[local_30];
            local_308[local_30] = local_1c8[local_30] + -1;
          }
        }
        else if (*(long *)(&stack0xffffffffffffff68 + local_30 * 8) == 1) {
          if (local_208[local_30] < aCStack_188[local_30]) {
            local_2c8[local_30] = local_208[local_30] + 1;
            local_308[local_30] = local_208[local_30] + aCStack_148[local_30];
          }
          else {
            local_2c8[local_30] = 1;
            local_308[local_30] = aCStack_148[local_30];
          }
        }
        else {
          fprintf(_stderr,"Illegal mask value found\n");
        }
      }
      lVar7 = pnga_locate_region(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                                 in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                                 in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      if (lVar7 == 0) {
        sprintf(&stack0xfffffffffffffa78,"%s","cannot locate region: ");
        sVar8 = strlen("cannot locate region: ");
        sprintf(&stack0xfffffffffffffa78 + (int)sVar8,"%s",GA[in_RDI + 1000].name);
        sVar8 = strlen(&stack0xfffffffffffffa78);
        sprintf(&stack0xfffffffffffffa78 + (int)sVar8," [%ld:%ld ",local_2c8[0],local_308[0]);
        sVar8 = strlen(&stack0xfffffffffffffa78);
        local_478 = (int)sVar8;
        local_474 = 1;
        while( true ) {
          in_stack_fffffffffffff760 = (int *)(long)local_474;
          IVar9 = pnga_ndim(in_stack_fffffffffffff950);
          if (IVar9 <= (long)in_stack_fffffffffffff760) break;
          sprintf(&stack0xfffffffffffffa78 + local_478,",%ld:%ld ",local_2c8[local_474],
                  local_308[local_474]);
          sVar8 = strlen(&stack0xfffffffffffffa78);
          local_478 = (int)sVar8;
          local_474 = local_474 + 1;
        }
        sprintf(&stack0xfffffffffffffa78 + local_478,"%s","]");
        strlen(&stack0xfffffffffffffa78);
        pnga_error((char *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
                   CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
      }
      if (1 < local_48) {
        fprintf(_stderr,"More than one remote processor found\n");
      }
      lVar3 = *__ptr_00;
      pnga_distribution(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                        in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
      for (local_30 = 0; local_30 < local_e8; local_30 = local_30 + 1) {
        if (*(long *)(&stack0xffffffffffffff68 + local_30 * 8) == 0) {
          aCStack_248[local_30] = aCStack_148[local_30];
          alStack_288[local_30] =
               (local_208[local_30] - local_1c8[local_30]) + aCStack_148[local_30];
          aCStack_348[local_30] = aCStack_248[local_30];
        }
        else if (*(long *)(&stack0xffffffffffffff68 + local_30 * 8) == -1) {
          aCStack_248[local_30] = 0;
          alStack_288[local_30] = aCStack_148[local_30] + -1;
          aCStack_348[local_30] = (local_308[local_30] - local_2c8[local_30]) + 1;
        }
        else if (*(long *)(&stack0xffffffffffffff68 + local_30 * 8) == 1) {
          aCStack_248[local_30] =
               (local_208[local_30] - local_1c8[local_30]) + aCStack_148[local_30] + 1;
          alStack_288[local_30] =
               (local_208[local_30] - local_1c8[local_30]) + aCStack_148[local_30] * 2;
          aCStack_348[local_30] = aCStack_148[local_30];
        }
      }
      in_stack_fffffffffffffa68 = (Integer *)0x1;
      local_5a0 = (long)(GA[lVar5].ndim + -1);
      local_5a8 = 0;
      if (GA[lVar5].distr_type == 0) {
        if (GA[lVar5].num_rstrctd == 0) {
          lVar10 = (long)GA[lVar5].ndim;
          local_658 = 0;
          local_638 = 1;
          for (local_640 = 0; local_640 < lVar10; local_640 = local_640 + 1) {
            local_638 = GA[lVar5].nblock[local_640] * local_638;
          }
          if ((local_638 + -1 < IVar6) || (IVar6 < 0)) {
            for (local_640 = 0; local_640 < lVar10; local_640 = local_640 + 1) {
              local_5e8[local_640] = 0;
              local_628[local_640] = -1;
            }
          }
          else {
            local_648 = IVar6;
            for (local_640 = 0; local_640 < lVar10; local_640 = local_640 + 1) {
              lVar12 = local_648 % (long)GA[lVar5].nblock[local_640];
              local_648 = local_648 / (long)GA[lVar5].nblock[local_640];
              lVar11 = lVar12 + local_658;
              local_658 = GA[lVar5].nblock[local_640] + local_658;
              local_5e8[local_640] = GA[lVar5].mapc[lVar11];
              if (lVar12 == GA[lVar5].nblock[local_640] + -1) {
                local_628[local_640] = GA[lVar5].dims[local_640];
              }
              else {
                local_628[local_640] = GA[lVar5].mapc[lVar11 + 1] + -1;
              }
            }
          }
        }
        else if (IVar6 < GA[lVar5].num_rstrctd) {
          lVar10 = (long)GA[lVar5].ndim;
          local_690 = 0;
          local_670 = 1;
          for (local_678 = 0; local_678 < lVar10; local_678 = local_678 + 1) {
            local_670 = GA[lVar5].nblock[local_678] * local_670;
          }
          if ((local_670 + -1 < IVar6) || (IVar6 < 0)) {
            for (local_678 = 0; local_678 < lVar10; local_678 = local_678 + 1) {
              local_5e8[local_678] = 0;
              local_628[local_678] = -1;
            }
          }
          else {
            local_680 = IVar6;
            for (local_678 = 0; local_678 < lVar10; local_678 = local_678 + 1) {
              lVar12 = local_680 % (long)GA[lVar5].nblock[local_678];
              local_680 = local_680 / (long)GA[lVar5].nblock[local_678];
              lVar11 = lVar12 + local_690;
              local_690 = GA[lVar5].nblock[local_678] + local_690;
              local_5e8[local_678] = GA[lVar5].mapc[lVar11];
              if (lVar12 == GA[lVar5].nblock[local_678] + -1) {
                local_628[local_678] = GA[lVar5].dims[local_678];
              }
              else {
                local_628[local_678] = GA[lVar5].mapc[lVar11 + 1] + -1;
              }
            }
          }
        }
        else {
          sVar1 = GA[lVar5].ndim;
          for (local_69c = 0; local_69c < sVar1; local_69c = local_69c + 1) {
            local_5e8[local_69c] = 0;
            local_628[local_69c] = -1;
          }
        }
      }
      else {
        iVar14 = (int)IVar6;
        if (((GA[lVar5].distr_type == 1) || (GA[lVar5].distr_type == 2)) ||
           (GA[lVar5].distr_type == 3)) {
          sVar1 = GA[lVar5].ndim;
          local_6d0 = (int)sVar1;
          sVar2 = GA[lVar5].ndim;
          local_6dc = (int)sVar2;
          local_6d4 = iVar14;
          local_6c8[0] = (int)((long)iVar14 % GA[lVar5].num_blocks[0]);
          for (local_6d8 = 1; local_6d8 < sVar2; local_6d8 = local_6d8 + 1) {
            local_6d4 = (int)((long)(local_6d4 - local_6c8[local_6d8 + -1]) /
                             GA[lVar5].num_blocks[local_6d8 + -1]);
            local_6c8[local_6d8] = (int)((long)local_6d4 % GA[lVar5].num_blocks[local_6d8]);
          }
          for (local_6cc = 0; local_6cc < sVar1; local_6cc = local_6cc + 1) {
            local_5e8[local_6cc] = (long)local_6c8[local_6cc] * GA[lVar5].block_dims[local_6cc] + 1;
            local_628[local_6cc] =
                 (long)(local_6c8[local_6cc] + 1) * GA[lVar5].block_dims[local_6cc];
            if (GA[lVar5].dims[local_6cc] < local_628[local_6cc]) {
              local_628[local_6cc] = GA[lVar5].dims[local_6cc];
            }
          }
        }
        else if (GA[lVar5].distr_type == 4) {
          in_stack_fffffffffffff900 = (int)GA[lVar5].ndim;
          in_stack_fffffffffffff8fc = 0;
          sVar1 = GA[lVar5].ndim;
          local_710 = (int)sVar1;
          local_6f8[0] = (int)((long)iVar14 % GA[lVar5].num_blocks[0]);
          for (local_70c = 1; local_70c < sVar1; local_70c = local_70c + 1) {
            iVar14 = (int)((long)(iVar14 - local_6f8[local_70c + -1]) /
                          GA[lVar5].num_blocks[local_70c + -1]);
            local_6f8[local_70c] = (int)((long)iVar14 % GA[lVar5].num_blocks[local_70c]);
          }
          for (in_stack_fffffffffffff904 = 0; in_stack_fffffffffffff8f8 = iVar14,
              in_stack_fffffffffffff904 < in_stack_fffffffffffff900;
              in_stack_fffffffffffff904 = in_stack_fffffffffffff904 + 1) {
            local_5e8[in_stack_fffffffffffff904] =
                 GA[lVar5].mapc[in_stack_fffffffffffff8fc + local_6f8[in_stack_fffffffffffff904]];
            if ((long)local_6f8[in_stack_fffffffffffff904] <
                GA[lVar5].num_blocks[in_stack_fffffffffffff904] + -1) {
              local_628[in_stack_fffffffffffff904] =
                   GA[lVar5].mapc
                   [in_stack_fffffffffffff8fc + local_6f8[in_stack_fffffffffffff904] + 1] + -1;
            }
            else {
              local_628[in_stack_fffffffffffff904] = GA[lVar5].dims[in_stack_fffffffffffff904];
            }
            in_stack_fffffffffffff8fc =
                 in_stack_fffffffffffff8fc + (int)GA[lVar5].num_blocks[in_stack_fffffffffffff904];
          }
        }
      }
      if (local_5a0 == 0) {
        local_388[0] = (local_628[0] - local_5e8[0]) + 1 + GA[lVar5].width[0] * 2;
      }
      for (in_stack_fffffffffffffa70 = (Integer *)0x0; (long)in_stack_fffffffffffffa70 < local_5a0;
          in_stack_fffffffffffffa70 = (Integer *)((long)in_stack_fffffffffffffa70 + 1)) {
        local_5a8 = aCStack_248[(long)in_stack_fffffffffffffa70] * (long)in_stack_fffffffffffffa68 +
                    local_5a8;
        local_388[(long)in_stack_fffffffffffffa70] =
             (local_628[(long)in_stack_fffffffffffffa70] -
             local_5e8[(long)in_stack_fffffffffffffa70]) + 1 +
             GA[lVar5].width[(long)in_stack_fffffffffffffa70] * 2;
        in_stack_fffffffffffffa68 =
             (Integer *)
             (local_388[(long)in_stack_fffffffffffffa70] * (long)in_stack_fffffffffffffa68);
      }
      local_5a8 = aCStack_248[local_5a0] * (long)in_stack_fffffffffffffa68 + local_5a8;
      local_720 = 1;
      local_728 = (long)(GA[lVar5].ndim + -1);
      local_730 = 0;
      if (GA[lVar5].distr_type == 0) {
        if (GA[lVar5].num_rstrctd == 0) {
          local_7d0 = (long)GA[lVar5].ndim;
          local_7d8 = 0;
          local_7b8 = 1;
          for (local_7c0 = 0; local_7c0 < local_7d0; local_7c0 = local_7c0 + 1) {
            local_7b8 = GA[lVar5].nblock[local_7c0] * local_7b8;
          }
          if ((local_7b8 + -1 < lVar3) || (lVar3 < 0)) {
            for (local_7c0 = 0; local_7c0 < local_7d0; local_7c0 = local_7c0 + 1) {
              local_768[local_7c0] = 0;
              local_7a8[local_7c0] = -1;
            }
          }
          else {
            local_7c8 = lVar3;
            for (local_7c0 = 0; local_7c0 < local_7d0; local_7c0 = local_7c0 + 1) {
              local_7b0 = local_7c8 % (long)GA[lVar5].nblock[local_7c0];
              local_7c8 = local_7c8 / (long)GA[lVar5].nblock[local_7c0];
              local_7e0 = local_7b0 + local_7d8;
              local_7d8 = GA[lVar5].nblock[local_7c0] + local_7d8;
              local_768[local_7c0] = GA[lVar5].mapc[local_7e0];
              if (local_7b0 == GA[lVar5].nblock[local_7c0] + -1) {
                local_7a8[local_7c0] = GA[lVar5].dims[local_7c0];
              }
              else {
                local_7a8[local_7c0] = GA[lVar5].mapc[local_7e0 + 1] + -1;
              }
            }
          }
        }
        else if (lVar3 < GA[lVar5].num_rstrctd) {
          local_808 = (long)GA[lVar5].ndim;
          local_810 = 0;
          local_7f0 = 1;
          for (local_7f8 = 0; local_7f8 < local_808; local_7f8 = local_7f8 + 1) {
            local_7f0 = GA[lVar5].nblock[local_7f8] * local_7f0;
          }
          if ((local_7f0 + -1 < lVar3) || (lVar3 < 0)) {
            for (local_7f8 = 0; local_7f8 < local_808; local_7f8 = local_7f8 + 1) {
              local_768[local_7f8] = 0;
              local_7a8[local_7f8] = -1;
            }
          }
          else {
            local_800 = lVar3;
            for (local_7f8 = 0; local_7f8 < local_808; local_7f8 = local_7f8 + 1) {
              local_7e8 = local_800 % (long)GA[lVar5].nblock[local_7f8];
              local_800 = local_800 / (long)GA[lVar5].nblock[local_7f8];
              local_818 = local_7e8 + local_810;
              local_810 = GA[lVar5].nblock[local_7f8] + local_810;
              local_768[local_7f8] = GA[lVar5].mapc[local_818];
              if (local_7e8 == GA[lVar5].nblock[local_7f8] + -1) {
                local_7a8[local_7f8] = GA[lVar5].dims[local_7f8];
              }
              else {
                local_7a8[local_7f8] = GA[lVar5].mapc[local_818 + 1] + -1;
              }
            }
          }
        }
        else {
          sVar1 = GA[lVar5].ndim;
          local_820 = (int)sVar1;
          for (local_81c = 0; local_81c < sVar1; local_81c = local_81c + 1) {
            local_768[local_81c] = 0;
            local_7a8[local_81c] = -1;
          }
        }
      }
      else {
        local_854 = (int)lVar3;
        if (((GA[lVar5].distr_type == 1) || (GA[lVar5].distr_type == 2)) ||
           (GA[lVar5].distr_type == 3)) {
          sVar1 = GA[lVar5].ndim;
          sVar2 = GA[lVar5].ndim;
          local_848[0] = (int)((long)local_854 % GA[lVar5].num_blocks[0]);
          for (local_858 = 1; local_858 < sVar2; local_858 = local_858 + 1) {
            local_854 = (int)((long)(local_854 - local_848[local_858 + -1]) /
                             GA[lVar5].num_blocks[local_858 + -1]);
            local_848[local_858] = (int)((long)local_854 % GA[lVar5].num_blocks[local_858]);
          }
          for (local_84c = 0; local_84c < sVar1; local_84c = local_84c + 1) {
            local_768[local_84c] = (long)local_848[local_84c] * GA[lVar5].block_dims[local_84c] + 1;
            local_7a8[local_84c] =
                 (long)(local_848[local_84c] + 1) * GA[lVar5].block_dims[local_84c];
            if (GA[lVar5].dims[local_84c] < local_7a8[local_84c]) {
              local_7a8[local_84c] = GA[lVar5].dims[local_84c];
            }
          }
        }
        else if (GA[lVar5].distr_type == 4) {
          in_stack_fffffffffffff780 = (int)GA[lVar5].ndim;
          in_stack_fffffffffffff77c = 0;
          in_stack_fffffffffffff770 = (int)GA[lVar5].ndim;
          local_878[0] = (int)((long)local_854 % GA[lVar5].num_blocks[0]);
          for (in_stack_fffffffffffff774 = 1; in_stack_fffffffffffff774 < in_stack_fffffffffffff770;
              in_stack_fffffffffffff774 = in_stack_fffffffffffff774 + 1) {
            local_854 = (int)((long)(local_854 - local_878[in_stack_fffffffffffff774 + -1]) /
                             GA[lVar5].num_blocks[in_stack_fffffffffffff774 + -1]);
            local_878[in_stack_fffffffffffff774] =
                 (int)((long)local_854 % GA[lVar5].num_blocks[in_stack_fffffffffffff774]);
          }
          for (in_stack_fffffffffffff784 = 0; in_stack_fffffffffffff778 = local_854,
              in_stack_fffffffffffff784 < in_stack_fffffffffffff780;
              in_stack_fffffffffffff784 = in_stack_fffffffffffff784 + 1) {
            local_768[in_stack_fffffffffffff784] =
                 GA[lVar5].mapc[in_stack_fffffffffffff77c + local_878[in_stack_fffffffffffff784]];
            if ((long)local_878[in_stack_fffffffffffff784] <
                GA[lVar5].num_blocks[in_stack_fffffffffffff784] + -1) {
              local_7a8[in_stack_fffffffffffff784] =
                   GA[lVar5].mapc
                   [in_stack_fffffffffffff77c + local_878[in_stack_fffffffffffff784] + 1] + -1;
            }
            else {
              local_7a8[in_stack_fffffffffffff784] = GA[lVar5].dims[in_stack_fffffffffffff784];
            }
            in_stack_fffffffffffff77c =
                 in_stack_fffffffffffff77c + (int)GA[lVar5].num_blocks[in_stack_fffffffffffff784];
          }
        }
      }
      if (local_728 == 0) {
        local_3c8[0] = (local_7a8[0] - local_768[0]) + 1 + GA[lVar5].width[0] * 2;
      }
      for (local_718 = 0; local_718 < local_728; local_718 = local_718 + 1) {
        local_730 = aCStack_348[local_718] * local_720 + local_730;
        local_3c8[local_718] =
             (local_7a8[local_718] - local_768[local_718]) + 1 + GA[lVar5].width[local_718] * 2;
        local_720 = local_3c8[local_718] * local_720;
      }
      local_730 = aCStack_348[local_728] * local_720 + local_730;
      local_3f8[0] = (int)local_e0;
      local_418[0] = (int)local_e0;
      for (iVar14 = 0; (long)iVar14 < local_e8 + -1; iVar14 = iVar14 + 1) {
        local_418[iVar14] = (int)local_3c8[iVar14] * local_418[iVar14];
        local_3f8[iVar14] = (int)local_388[iVar14] * local_3f8[iVar14];
        local_418[iVar14 + 1] = local_418[iVar14];
        local_3f8[iVar14 + 1] = local_3f8[iVar14];
      }
      for (iVar13 = 0; iVar13 < local_e8; iVar13 = iVar13 + 1) {
        local_438[iVar13] = ((int)alStack_288[iVar13] - (int)aCStack_248[iVar13]) + 1;
      }
      local_438[0] = local_438[0] * (int)local_e0;
      ARMCI_GetS((void *)CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                 (int *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778),
                 (void *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770),
                 (int *)CONCAT44(iVar14,iVar13),in_stack_fffffffffffff760,in_stack_fffffffffffff75c,
                 in_stack_fffffffffffff790);
    }
    if (iVar4 != 0) {
      pnga_pgroup_sync((Integer)in_stack_fffffffffffff760);
    }
    free(__ptr);
    free(__ptr_00);
  }
  return 1;
}

Assistant:

logical pnga_update_ghost_dir(Integer g_a,    /* GA handle */
                                   Integer pdim,   /* Dimension of update */
                                   Integer pdir,   /* Direction of update (+/-1) */
                                   logical pflag)  /* include corner cells */
{
  Integer idx, ipx, inx, np, handle=GA_OFFSET + g_a, proc_rem;
  Integer ntot, mask[MAXDIM],lmask[MAXDIM];
  Integer size, ndim, i, itmp, idim, idir;
  Integer width[MAXDIM], dims[MAXDIM];
  Integer lo_loc[MAXDIM], hi_loc[MAXDIM];
  Integer plo_loc[MAXDIM], phi_loc[MAXDIM];
  Integer tlo_rem[MAXDIM], thi_rem[MAXDIM];
  Integer plo_rem[MAXDIM]/*, phi_rem[MAXDIM]*/;
  Integer ld_loc[MAXDIM], ld_rem[MAXDIM];
  logical flag;
  int stride_loc[MAXDIM], stride_rem[MAXDIM],count[MAXDIM];
  char *ptr_loc, *ptr_rem;
  Integer me = pnga_nodeid();
  Integer p_handle;
  Integer *_ga_map = NULL;
  Integer *_ga_proclist = NULL;
  int local_sync_begin,local_sync_end;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/

  /* if global array has no ghost cells, just return */
  if (!pnga_has_ghosts(g_a)) 
    return TRUE;
  
  p_handle = GA[handle].p_handle;
  if(local_sync_begin)pnga_pgroup_sync(p_handle);
  idim = pdim;
  idir = pdir;
  flag = pflag;

  size = GA[handle].elemsize;
  ndim = GA[handle].ndim;
  /* initialize ghost cell widths and get array dimensions */
  for (idx=0; idx < ndim; idx++) {
    width[idx] = (Integer)GA[handle].width[idx];
    dims[idx] = (Integer)GA[handle].dims[idx];
  }

  /* Check to make sure that global array is well-behaved (all processors
     have data and the width of the data in each dimension is greater than
     the corresponding value in width[]). */
  ipx = 0;
  for (idx = 0; idx < ndim; idx++) {
    for (np = 0; np < GA[handle].nblock[idx]; np++) {
      if (np < GA[handle].nblock[idx] - 1) {
        if (GA[handle].mapc[ipx+1]-GA[handle].mapc[ipx]+1<width[idx]) {
          return FALSE;
        }
      } else {
        if (GA[handle].dims[idx]-GA[handle].mapc[ipx]+1<width[idx]) {
          return FALSE;
        }
      }
      ipx++;
    }
  }

  _ga_map = malloc((GAnproc*2*MAXDIM+1)*sizeof(Integer));
  if(!_ga_map) pnga_error("pnga_update_ghost_dir:malloc failed (_ga_map)",0);
  _ga_proclist = malloc((GAnproc*2*MAXDIM+1)*sizeof(Integer));
  if(!_ga_proclist) pnga_error("pnga_update_ghost_dir:malloc failed (_ga_proclist)",0);

  /* Get pointer to local memory */
  ptr_loc = GA[handle].ptr[GAme];
  /* obtain range of data that is held by local processor */
  pnga_distribution(g_a,me,lo_loc,hi_loc);

  /* evaluate total number of GET operations */
  ntot = 1;
  if (flag) {
    for (idx=0; idx < ndim-1; idx++) ntot *= 3;
  }

  /* Loop over all GET operations. */
  for (ipx=0; ipx < ntot; ipx++) {
    /* Convert ipx to corresponding mask values */
    if (flag) {
      itmp = ipx;
      for (idx = 0; idx < ndim-1; idx++) {
        i = itmp%3;
        lmask[idx] = i-1;
        itmp = (itmp-i)/3;
      }
    } else {
      for (idx = 0; idx < ndim-1; idx++) lmask[idx] = 0;
    }
    inx = 0;
    for (idx = 0; idx < ndim; idx++) {
      if (idx == idim-1) {
        mask[idx] = idir;
      } else {
        mask[idx] = lmask[inx];
        inx++;
      }
    }
    /* Now that mask has been determined, find processor that contains
     * data needed by the corresponding block of ghost cells */
    for (idx = 0; idx < ndim; idx++) {
      if (mask[idx] == 0) {
        tlo_rem[idx] = lo_loc[idx];
        thi_rem[idx] = hi_loc[idx];
      } else if (mask[idx] == -1) {
        if (lo_loc[idx] > 1) {
          tlo_rem[idx] = lo_loc[idx]-width[idx];
          thi_rem[idx] = lo_loc[idx]-1;
        } else {
          tlo_rem[idx] = dims[idx]-width[idx]+1;
          thi_rem[idx] = dims[idx];
        }
      } else if (mask[idx] == 1) {
        if (hi_loc[idx] < dims[idx]) {
          tlo_rem[idx] = hi_loc[idx] + 1;
          thi_rem[idx] = hi_loc[idx] + width[idx];
        } else {
          tlo_rem[idx] = 1;
          thi_rem[idx] = width[idx];
        }
      } else {
        fprintf(stderr,"Illegal mask value found\n");
      }
    }
    /* Locate remote processor to which data must be sent */
    if (!pnga_locate_region(g_a, tlo_rem, thi_rem, _ga_map,
       _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
       tlo_rem, thi_rem, g_a);
    if (np > 1) {
      fprintf(stderr,"More than one remote processor found\n");
    }
    /* Remote processor has been identified, now get ready to get
       data from it. Start by getting distribution on remote
       processor.*/
    proc_rem = _ga_proclist[0];
    pnga_distribution(g_a, proc_rem, tlo_rem, thi_rem);
    for (idx = 0; idx < ndim; idx++) {
      if (mask[idx] == 0) {
        plo_loc[idx] = width[idx];
        phi_loc[idx] = hi_loc[idx]-lo_loc[idx]+width[idx];
        plo_rem[idx] = plo_loc[idx];
        /*phi_rem[idx] = phi_loc[idx];*/
      } else if (mask[idx] == -1) {
        plo_loc[idx] = 0;
        phi_loc[idx] = width[idx]-1;
        plo_rem[idx] = thi_rem[idx]-tlo_rem[idx]+1;
        /*phi_rem[idx] = thi_rem[idx]-tlo_rem[idx]+width[idx];*/
      } else if (mask[idx] == 1) {
        plo_loc[idx] = hi_loc[idx]-lo_loc[idx]+width[idx]+1;
        phi_loc[idx] = hi_loc[idx]-lo_loc[idx]+2*width[idx];
        plo_rem[idx] = width[idx];
        /*phi_rem[idx] = 2*width[idx]-1;*/
      }
    }
    /* Get pointer to local data buffer and remote data
       buffer as well as lists of leading dimenstions */
    gam_LocationWithGhosts(me, handle, plo_loc, &ptr_loc, ld_loc);
    gam_LocationWithGhosts(proc_rem, handle, plo_rem, &ptr_rem, ld_rem);

    /* Evaluate strides on local and remote processors */
    gam_setstride(ndim, size, ld_loc, ld_rem, stride_rem,
                  stride_loc);

    /* Compute the number of elements in each dimension and store
       result in count. Scale the first element in count by the
       element size. */
    gam_ComputeCount(ndim, plo_loc, phi_loc, count);
    count[0] *= size;
 
    /* get data from remote processor */
    if (p_handle >= 0) {
      proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem];
    }
    ARMCI_GetS(ptr_rem, stride_rem, ptr_loc, stride_loc, count,
          (int)(ndim - 1), (int)proc_rem);
  }

  if(local_sync_end)pnga_pgroup_sync(p_handle);
  free(_ga_map);
  free(_ga_proclist);
  return TRUE;
}